

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O3

Min_Cube_t *
Abc_NodeCovProduct(Cov_Man_t *p,Min_Cube_t *pCover0,Min_Cube_t *pCover1,int fEsop,int nSupp)

{
  int iVar1;
  Min_Man_t *pMVar2;
  Min_Cube_t *pMVar3;
  Min_Cube_t **ppMVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  Min_Cube_t *pMVar9;
  Min_Cube_t *pMVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  
  if ((pCover0 == (Min_Cube_t *)0x0) || (pCover1 == (Min_Cube_t *)0x0)) {
    __assert_fail("pCover0 && pCover1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                  ,0x1da,
                  "Min_Cube_t *Abc_NodeCovProduct(Cov_Man_t *, Min_Cube_t *, Min_Cube_t *, int, int)"
                 );
  }
  Min_ManClean(p->pManMin,nSupp);
  pMVar10 = pCover1;
  while( true ) {
    lVar8 = (long)p->vPairs0->nSize;
    if (0 < lVar8) {
      lVar14 = 0;
      do {
        iVar7 = p->vPairs0->pArray[lVar14];
        iVar1 = p->vPairs1->pArray[lVar14];
        if ((pMVar10->uData[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU) &
             pCover0->uData[iVar7 >> 4] >> ((char)iVar7 * '\x02' & 0x1fU) & 3) == 0)
        goto LAB_0044b3e6;
        lVar14 = lVar14 + 1;
      } while (lVar8 != lVar14);
    }
    pMVar2 = p->pManMin;
    if (p->nCubesMax < pMVar2->nCubes) break;
    pMVar9 = (Min_Cube_t *)Extra_MmFixedEntryFetch(pMVar2->pMemMan);
    pMVar9->pNext = (Min_Cube_t *)0x0;
    uVar6 = pMVar2->nVars & 0x3ff;
    *(uint *)&pMVar9->field_0x8 = *(uint *)&pMVar9->field_0x8 & 0xfffffc00 | uVar6;
    uVar6 = (pMVar2->nWords & 0xfffU) << 10 | uVar6;
    *(uint *)&pMVar9->field_0x8 = uVar6;
    memset(pMVar9->uData,0xff,(long)pMVar2->nWords << 2);
    *(uint *)&pMVar9->field_0x8 = uVar6;
    if (0 < nSupp) {
      bVar5 = 0;
      uVar11 = 0;
      do {
        iVar7 = p->vComTo0->pArray[uVar11];
        uVar12 = 3;
        uVar13 = 3;
        if (iVar7 != -1) {
          uVar13 = pCover0->uData[iVar7 >> 4] >> ((char)iVar7 * '\x02' & 0x1fU) & 3;
        }
        iVar7 = p->vComTo1->pArray[uVar11];
        if (iVar7 != -1) {
          uVar12 = pMVar10->uData[iVar7 >> 4] >> ((char)iVar7 * '\x02' & 0x1fU);
        }
        if ((uVar12 & uVar13) != 3) {
          pMVar9->uData[uVar11 >> 4 & 0xfffffff] =
               pMVar9->uData[uVar11 >> 4 & 0xfffffff] ^ (uVar12 & uVar13 ^ 3) << (bVar5 & 0x1e);
          uVar6 = uVar6 + 0x400000;
          *(uint *)&pMVar9->field_0x8 = uVar6;
        }
        uVar11 = uVar11 + 1;
        bVar5 = bVar5 + 2;
      } while ((uint)nSupp != uVar11);
    }
    if (fEsop == 0) {
      Min_SopAddCube(p->pManMin,pMVar9);
    }
    else {
      Min_EsopAddCube(p->pManMin,pMVar9);
    }
LAB_0044b3e6:
    ppMVar4 = &pMVar10->pNext;
    pMVar10 = *ppMVar4;
    if ((*ppMVar4 == (Min_Cube_t *)0x0) &&
       (pCover0 = pCover0->pNext, pMVar10 = pCover1, pCover0 == (Min_Cube_t *)0x0)) {
      if (fEsop == 0) {
        Min_SopMinimize(p->pManMin);
      }
      else {
        Min_EsopMinimize(p->pManMin);
      }
      pMVar10 = Min_CoverCollect(p->pManMin,nSupp);
      if (pMVar10 == (Min_Cube_t *)0x0) {
LAB_0044b475:
        pMVar10 = (Min_Cube_t *)0x0;
      }
      else {
        iVar7 = -1;
        pMVar9 = pMVar10;
        do {
          pMVar9 = pMVar9->pNext;
          iVar7 = iVar7 + 1;
        } while (pMVar9 != (Min_Cube_t *)0x0);
        if (p->nFaninMax <= iVar7) {
          pMVar2 = p->pManMin;
          pMVar9 = pMVar10;
          do {
            pMVar3 = pMVar9->pNext;
            Extra_MmFixedEntryRecycle(pMVar2->pMemMan,(char *)pMVar9);
            pMVar10 = (Min_Cube_t *)0x0;
            pMVar9 = pMVar3;
          } while (pMVar3 != (Min_Cube_t *)0x0);
        }
      }
      return pMVar10;
    }
  }
  pMVar10 = Min_CoverCollect(pMVar2,nSupp);
  if (pMVar10 != (Min_Cube_t *)0x0) {
    pMVar2 = p->pManMin;
    do {
      pMVar9 = pMVar10->pNext;
      Extra_MmFixedEntryRecycle(pMVar2->pMemMan,(char *)pMVar10);
      pMVar10 = pMVar9;
    } while (pMVar9 != (Min_Cube_t *)0x0);
    return (Min_Cube_t *)0x0;
  }
  goto LAB_0044b475;
}

Assistant:

Min_Cube_t * Abc_NodeCovProduct( Cov_Man_t * p, Min_Cube_t * pCover0, Min_Cube_t * pCover1, int fEsop, int nSupp )
{
    Min_Cube_t * pCube, * pCube0, * pCube1;
    Min_Cube_t * pCover;
    int i, Val0, Val1;
    assert( pCover0 && pCover1 );

    // clean storage
    Min_ManClean( p->pManMin, nSupp );
    // go through the cube pairs
    Min_CoverForEachCube( pCover0, pCube0 )
    Min_CoverForEachCube( pCover1, pCube1 )
    {
        // go through the support variables of the cubes
        for ( i = 0; i < p->vPairs0->nSize; i++ )
        {
            Val0 = Min_CubeGetVar( pCube0, p->vPairs0->pArray[i] );
            Val1 = Min_CubeGetVar( pCube1, p->vPairs1->pArray[i] );
            if ( (Val0 & Val1) == 0 )
                break;
        }
        // check disjointness
        if ( i < p->vPairs0->nSize )
            continue;

        if ( p->pManMin->nCubes > p->nCubesMax )
        {
            pCover = Min_CoverCollect( p->pManMin, nSupp );
//Min_CoverWriteFile( pCover, "large", 1 );
            Min_CoverRecycle( p->pManMin, pCover );
            return NULL;
        }

        // create the product cube
        pCube = Min_CubeAlloc( p->pManMin );

        // add the literals
        pCube->nLits = 0;
        for ( i = 0; i < nSupp; i++ )
        {
            if ( p->vComTo0->pArray[i] == -1 )
                Val0 = 3;
            else
                Val0 = Min_CubeGetVar( pCube0, p->vComTo0->pArray[i] );

            if ( p->vComTo1->pArray[i] == -1 )
                Val1 = 3;
            else
                Val1 = Min_CubeGetVar( pCube1, p->vComTo1->pArray[i] );

            if ( (Val0 & Val1) == 3 )
                continue;

            Min_CubeXorVar( pCube, i, (Val0 & Val1) ^ 3 );
            pCube->nLits++;
        }
        // add the cube to storage
        if ( fEsop ) 
            Min_EsopAddCube( p->pManMin, pCube );
        else
            Min_SopAddCube( p->pManMin, pCube );
    }

    // minimize the cover
    if ( fEsop ) 
        Min_EsopMinimize( p->pManMin );
    else
        Min_SopMinimize( p->pManMin );
    pCover = Min_CoverCollect( p->pManMin, nSupp );

    // quit if the cover is too large
    if ( Min_CoverCountCubes(pCover) > p->nFaninMax )
    {
/*        
Min_CoverWriteFile( pCover, "large", 1 );
        Min_CoverExpand( p->pManMin, pCover );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        pCover = Min_CoverCollect( p->pManMin, nSupp );
*/
        Min_CoverRecycle( p->pManMin, pCover );
        return NULL;
    }
    return pCover;
}